

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitTableCopy(PrintExpressionContents *this,TableCopy *curr)

{
  string_view str;
  
  str._M_str = "table.copy ";
  str._M_len = 0xb;
  printMedium(this->o,str);
  Name::print(&curr->destTable,this->o);
  std::operator<<(this->o,' ');
  Name::print(&curr->sourceTable,this->o);
  return;
}

Assistant:

void visitTableCopy(TableCopy* curr) {
    printMedium(o, "table.copy ");
    curr->destTable.print(o);
    o << ' ';
    curr->sourceTable.print(o);
  }